

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationvisitor.cpp
# Opt level: O3

void __thiscall
CalculationVisitor::visit
          (CalculationVisitor *this,Expression *parent,VariableExpression *expression)

{
  iterator *piVar1;
  Environment *this_00;
  _Elt_pointer pRVar2;
  bool bVar3;
  runtime_error *this_01;
  long *plVar4;
  long *plVar5;
  ResultValue value;
  string sStack_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ResultValue local_58;
  
  ResultValue::ResultValue(&local_58);
  this_00 = this->mEnvironment;
  VariableExpression::name_abi_cxx11_(&local_98,expression);
  bVar3 = Environment::getVariable(this_00,&local_98,&local_58,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pRVar2 = (this->mEvaluationStack).c.super__Deque_base<ResultValue,_std::allocator<ResultValue>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pRVar2 == (this->mEvaluationStack).c.
                  super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<ResultValue,std::allocator<ResultValue>>::_M_push_back_aux<ResultValue_const&>
                ((deque<ResultValue,std::allocator<ResultValue>> *)&this->mEvaluationStack,&local_58
                );
    }
    else {
      *(undefined8 *)((pRVar2->mComplexValue)._M_value + 8) = local_58.mComplexValue._M_value._8_8_;
      pRVar2->mFloatValue = local_58.mFloatValue;
      *(undefined8 *)(pRVar2->mComplexValue)._M_value = local_58.mComplexValue._M_value._0_8_;
      pRVar2->mType = local_58.mType;
      *(undefined4 *)&pRVar2->field_0x4 = local_58._4_4_;
      pRVar2->mIntValue = local_58.mIntValue;
      piVar1 = &(this->mEvaluationStack).c.
                super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  VariableExpression::name_abi_cxx11_(&sStack_d8,expression);
  std::operator+(&local_78,"\'",&sStack_d8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_b8 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_b8 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar4[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
  }
  local_b0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_b8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CalculationVisitor::visit(Expression* parent, VariableExpression* expression) {
	ResultValue value;
	if (mEnvironment.getVariable(expression->name(), value, true)) {
		mEvaluationStack.push(value);
	} else {
		throw std::runtime_error("'" + expression->name() + "' is not a defined variable. Type ':help' for a list of commands.");
	}
}